

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementHexaCorot_8::ChElementHexaCorot_8(ChElementHexaCorot_8 *this)

{
  ChGaussIntegrationRule *this_00;
  
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron =
       (_func_int **)&PTR__ChElementHexahedron_01180e88;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117f7d0;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ChElementCorotational::ChElementCorotational(&this->super_ChElementCorotational);
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = (_func_int **)0x1180a00;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0x1180b20;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0x1180be0;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1180c70;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_data = (double *)0x0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_rows = 0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_cols = 0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_data = (double *)0x0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_rows = 0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_cols = 0;
  this->ir = (ChGaussIntegrationRule *)0x0;
  (this->GpVector).
  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GpVector).
  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GpVector).
  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Volume = 0.0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->nodes,8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->StiffnessMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,0x18,0x18);
  this_00 = (ChGaussIntegrationRule *)::operator_new(8);
  ChGaussIntegrationRule::ChGaussIntegrationRule(this_00);
  this->ir = this_00;
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[8])(this);
  return;
}

Assistant:

ChElementHexaCorot_8::ChElementHexaCorot_8() : ir(nullptr), Volume(0) {
    nodes.resize(8);
    StiffnessMatrix.setZero(24, 24);
    this->ir = new ChGaussIntegrationRule;
    this->SetDefaultIntegrationRule();
}